

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varintdecode.c
# Opt level: O3

uint64_t masked_vbyte_read_group(uint8_t *in,uint32_t *out,uint64_t mask,uint64_t *ints_read)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  byte bVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  auVar8 = vlddqu_avx(*(undefined1 (*) [16])in);
  if ((short)mask == 0) {
    auVar9 = vpmovsxbd_avx(auVar8);
    bVar6 = 0x10;
    *(undefined1 (*) [16])out = auVar9;
    auVar9 = vpshufd_avx(auVar8,0x55);
    auVar9 = vpmovsxbd_avx(auVar9);
    *(undefined1 (*) [16])(out + 4) = auVar9;
    auVar9 = vpshufd_avx(auVar8,0xee);
    auVar10 = vpshufd_avx(auVar8,0xff);
    auVar8 = vpmovsxbd_avx(auVar9);
    auVar9 = vpmovsxbd_avx(auVar10);
    *(undefined1 (*) [16])(out + 8) = auVar8;
    *(undefined1 (*) [16])(out + 0xc) = auVar9;
    *ints_read = 0x10;
  }
  else {
    uVar7 = (uint)mask & 0xfff;
    bVar1 = combined_lookup[uVar7].index;
    bVar6 = combined_lookup[uVar7].bytes_consumed;
    auVar9 = *(undefined1 (*) [16])("" + (ulong)bVar1 * 0x10);
    if (bVar1 < 0x40) {
      auVar8 = vpshufb_avx(auVar8,auVar9);
      *ints_read = 6;
      auVar9 = vpsrlw_avx(auVar8,1);
      auVar2._8_8_ = 0x3f803f803f803f80;
      auVar2._0_8_ = 0x3f803f803f803f80;
      auVar9 = vpandq_avx512vl(auVar9,auVar2);
      auVar3._8_8_ = 0x7f007f007f007f;
      auVar3._0_8_ = 0x7f007f007f007f;
      auVar8 = vpternlogq_avx512vl(auVar9,auVar8,auVar3,0xf8);
      auVar4._8_8_ = 0x3fff00003fff;
      auVar4._0_8_ = 0x3fff00003fff;
      auVar9 = vpandq_avx512vl(auVar8,auVar4);
      auVar8 = vpsrld_avx(auVar8,0x10);
      *(undefined1 (*) [16])out = auVar9;
      *(undefined1 (*) [16])(out + 4) = auVar8;
    }
    else if (bVar1 < 0x91) {
      auVar8 = vpshufb_avx(auVar8,auVar9);
      *ints_read = 4;
      auVar10 = vpsrld_avx(auVar8,1);
      auVar9._8_8_ = 0x3f8000003f80;
      auVar9._0_8_ = 0x3f8000003f80;
      auVar9 = vpandq_avx512vl(auVar10,auVar9);
      auVar10 = vpsrld_avx(auVar8,2);
      auVar5._8_8_ = 0x7f0000007f;
      auVar5._0_8_ = 0x7f0000007f;
      auVar9 = vpternlogq_avx512vl(auVar9,auVar8,auVar5,0xf8);
      auVar8._8_8_ = 0x1fc000001fc000;
      auVar8._0_8_ = 0x1fc000001fc000;
      auVar8 = vpternlogq_avx512vl(auVar9,auVar10,auVar8,0xf8);
      *(undefined1 (*) [16])out = auVar8;
    }
    else {
      auVar10[8] = 0x7f;
      auVar10._0_8_ = 0x7f7f7f7f7f7f7f7f;
      auVar10[9] = 0x7f;
      auVar10[10] = 0x7f;
      auVar10[0xb] = 0x7f;
      auVar10[0xc] = 0x7f;
      auVar10[0xd] = 0x7f;
      auVar10[0xe] = 0x7f;
      auVar10[0xf] = 0x7f;
      *ints_read = 2;
      auVar8 = vandpd_avx(auVar8,auVar10);
      auVar8 = vpshufb_avx(auVar8,auVar9);
      auVar9 = vpsllvw_avx512vl(auVar8,_DAT_00192aa0);
      auVar8 = vpshldq_avx512_vbmi2(auVar9,auVar8,8);
      auVar8 = vpor_avx(auVar8,auVar9);
      auVar8 = vpmovwb_avx512vl(auVar8);
      *(long *)out = auVar8._0_8_;
      out[2] = 0;
      out[3] = 0;
    }
  }
  return (ulong)bVar6;
}

Assistant:

static uint64_t masked_vbyte_read_group(const uint8_t *in, uint32_t *out,
                                        uint64_t mask, uint64_t *ints_read) {
  __m128i initial = _mm_lddqu_si128((const __m128i *)(in));
  __m128i *mout = (__m128i *)out;

  if (!(mask & 0xFFFF)) {
    __m128i result = _mm_cvtepi8_epi32(initial);
    _mm_storeu_si128(mout + 0, result);
    initial = _mm_srli_si128(initial, 4);
    result = _mm_cvtepi8_epi32(initial);
    _mm_storeu_si128(mout + 1, result);
    initial = _mm_srli_si128(initial, 4);
    result = _mm_cvtepi8_epi32(initial);
    _mm_storeu_si128(mout + 2, result);
    initial = _mm_srli_si128(initial, 4);
    result = _mm_cvtepi8_epi32(initial);
    _mm_storeu_si128(mout + 3, result);
    *ints_read = 16;
    return 16;
  }

  uint32_t low_12_bits = mask & 0xFFF;
  // combine index and bytes consumed into a single lookup
  index_bytes_consumed combined = combined_lookup[low_12_bits];
  uint64_t consumed = combined.bytes_consumed;
  uint8_t index = combined.index;

  // Slightly slower to use combined than to lookup individually?
  // uint64_t consumed = bytes_consumed[low_12_bits];
  // uint8_t index = vec_lookup[low_12_bits];

  __m128i shuffle_vector = vectors_sse3[index];
  //	__m128i shuffle_vector = {0, 0};  // speed check: 20% faster at large,
  //less at small

  if (index < 64) {
    *ints_read = 6;
    __m128i bytes_to_decode = _mm_shuffle_epi8(initial, shuffle_vector);
    __m128i low_bytes = _mm_and_si128(bytes_to_decode, _mm_set1_epi16(0x007F));
    __m128i high_bytes = _mm_and_si128(bytes_to_decode, _mm_set1_epi16(0x7F00));
    __m128i high_bytes_shifted = _mm_srli_epi16(high_bytes, 1);
    __m128i packed_result = _mm_or_si128(low_bytes, high_bytes_shifted);
    __m128i unpacked_result_a =
        _mm_and_si128(packed_result, _mm_set1_epi32(0x0000FFFF));
    _mm_storeu_si128(mout, unpacked_result_a);
    __m128i unpacked_result_b = _mm_srli_epi32(packed_result, 16);
    // _mm_storel_epi64(mout+1, unpacked_result_b);
    _mm_storeu_si128(mout + 1,
                     unpacked_result_b); // maybe faster to write 16 bytes?
    return consumed;
  }
  if (index < 145) {

    *ints_read = 4;

    __m128i bytes_to_decode = _mm_shuffle_epi8(initial, shuffle_vector);
    __m128i low_bytes =
        _mm_and_si128(bytes_to_decode, _mm_set1_epi32(0x0000007F));
    __m128i middle_bytes =
        _mm_and_si128(bytes_to_decode, _mm_set1_epi32(0x00007F00));
    __m128i high_bytes =
        _mm_and_si128(bytes_to_decode, _mm_set1_epi32(0x007F0000));
    __m128i middle_bytes_shifted = _mm_srli_epi32(middle_bytes, 1);
    __m128i high_bytes_shifted = _mm_srli_epi32(high_bytes, 2);
    __m128i low_middle = _mm_or_si128(low_bytes, middle_bytes_shifted);
    __m128i result = _mm_or_si128(low_middle, high_bytes_shifted);
    _mm_storeu_si128(mout, result);
    return consumed;
  }

  *ints_read = 2;

  __m128i data_bits = _mm_and_si128(initial, _mm_set1_epi8(0x7F));
  __m128i bytes_to_decode = _mm_shuffle_epi8(data_bits, shuffle_vector);
  __m128i split_bytes = _mm_mullo_epi16(
      bytes_to_decode, _mm_setr_epi16(128, 64, 32, 16, 128, 64, 32, 16));
  __m128i shifted_split_bytes = _mm_slli_epi64(split_bytes, 8);
  __m128i recombined = _mm_or_si128(split_bytes, shifted_split_bytes);
  __m128i low_byte = _mm_srli_epi64(bytes_to_decode, 56);
  __m128i result_evens = _mm_or_si128(recombined, low_byte);
  __m128i result = _mm_shuffle_epi8(
      result_evens,
      _mm_setr_epi8(0, 2, 4, 6, 8, 10, 12, 14, -1, -1, -1, -1, -1, -1, -1, -1));

  // _mm_storel_epi64(mout, result);
  _mm_storeu_si128(mout, result); // maybe faster to write 16 bytes?

  return consumed;
}